

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::PairwiseRankLoss::backward_impl
          (PairwiseRankLoss *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  char *__function;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  
  pfVar1 = fx->v;
  uVar7 = (ulong)(fx->d).nd;
  if (i == 0) {
    iVar8 = 1;
    iVar5 = 1;
    if (uVar7 != 0) {
      uVar9 = 0;
      do {
        iVar5 = iVar5 * (fx->d).d[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
    uVar6 = iVar5 * (fx->d).bd;
    uVar7 = (ulong)(dEdf->d).nd;
    if (uVar7 != 0) {
      iVar8 = 1;
      uVar9 = 0;
      do {
        iVar8 = iVar8 * (dEdf->d).d[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
    if (uVar6 != iVar8 * (dEdf->d).bd) goto LAB_001a6edc;
    uVar7 = (ulong)(dEdxi->d).nd;
    iVar5 = 1;
    if (uVar7 != 0) {
      uVar9 = 0;
      do {
        iVar5 = iVar5 * (dEdxi->d).d[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
    uVar4 = iVar5 * (dEdxi->d).bd;
    if (uVar4 != uVar6) {
      __function = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<cnn::FRectifyBackward, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::sub_assign_op<float, float>]"
      ;
      goto LAB_001a6f27;
    }
    if (uVar6 != 0) {
      pfVar2 = dEdf->v;
      pfVar3 = dEdxi->v;
      uVar7 = 0;
      do {
        pfVar3[uVar7] = pfVar3[uVar7] - (float)((uint)pfVar2[uVar7] & -(uint)(pfVar1[uVar7] != 0.0))
        ;
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
  }
  else {
    iVar8 = 1;
    iVar5 = 1;
    if (uVar7 != 0) {
      uVar9 = 0;
      do {
        iVar5 = iVar5 * (fx->d).d[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
    uVar6 = iVar5 * (fx->d).bd;
    uVar7 = (ulong)(dEdf->d).nd;
    if (uVar7 != 0) {
      iVar8 = 1;
      uVar9 = 0;
      do {
        iVar8 = iVar8 * (dEdf->d).d[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
    if (uVar6 != iVar8 * (dEdf->d).bd) {
LAB_001a6edc:
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                    "Eigen::CwiseBinaryOp<cnn::FRectifyBackward, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = cnn::FRectifyBackward, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                   );
    }
    uVar7 = (ulong)(dEdxi->d).nd;
    iVar5 = 1;
    if (uVar7 != 0) {
      uVar9 = 0;
      do {
        iVar5 = iVar5 * (dEdxi->d).d[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
    uVar4 = iVar5 * (dEdxi->d).bd;
    if (uVar4 != uVar6) {
      __function = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<cnn::FRectifyBackward, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
      ;
LAB_001a6f27:
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,__function);
    }
    if (uVar6 != 0) {
      pfVar2 = dEdf->v;
      pfVar3 = dEdxi->v;
      uVar7 = 0;
      do {
        pfVar3[uVar7] = (float)((uint)pfVar2[uVar7] & -(uint)(pfVar1[uVar7] != 0.0)) + pfVar3[uVar7]
        ;
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
  }
  return;
}

Assistant:

void PairwiseRankLoss::backward_impl(const vector<const Tensor*>& xs,
                                const Tensor& fx,
                                const Tensor& dEdf,
                                unsigned i,
                                Tensor& dEdxi) const {
#if HAVE_CUDA
  gpu::vpairwise_rank_loss_backward(dEdf.d.size(), (i == 0), fx.v, dEdf.v, dEdxi.v);
#else
  if (i == 0) {
    dEdxi.vec() -= fx.vec().binaryExpr(dEdf.vec(), FRectifyBackward());
  } else {
    dEdxi.vec() += fx.vec().binaryExpr(dEdf.vec(), FRectifyBackward());
  }
#endif
}